

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.hpp
# Opt level: O3

void __thiscall
Centaurus::Grammar<wchar_t>::print_nfa(Grammar<wchar_t> *this,wostream *os,ATNPath *path)

{
  ATNNode<wchar_t> *pAVar1;
  SimpleException *this_00;
  string local_38;
  
  pAVar1 = resolve(this,path);
  if (pAVar1->m_type == RegularTerminal) {
    (*(pAVar1->m_nfa).super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>._vptr_NFABase[3])
              (&pAVar1->m_nfa,os,
               &(path->
                super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                ).
                super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].first.m_id);
    return;
  }
  this_00 = (SimpleException *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"The specified node is not an NFA.","");
  SimpleException::SimpleException(this_00,&local_38);
  __cxa_throw(this_00,&SimpleException::typeinfo,SimpleException::~SimpleException);
}

Assistant:

virtual void print_nfa(std::wostream& os, const ATNPath& path) const override
    {
        const ATNNode<TCHAR>& node = resolve(path);

        if (node.type() != ATNNodeType::RegularTerminal)
        {
            throw SimpleException("The specified node is not an NFA.");
        }
        else
        {
            const NFA<TCHAR>& nfa = node.get_nfa();

            nfa.print(os, path.leaf_id().str());
        }
    }